

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

QRect __thiscall
QItemDelegate::textRectangle
          (QItemDelegate *this,QPainter *param_1,QRect *rect,QFont *font,QString *text)

{
  QTextLayout *pQVar1;
  QItemDelegatePrivate *this_00;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  int iVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  QSizeF QVar7;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  *(uint *)&this_00->textOption = *(uint *)&this_00->textOption & 0xffffe1ff | 0x200;
  pQVar1 = &this_00->textLayout;
  QTextLayout::setTextOption((QTextOption *)pQVar1);
  QTextLayout::setFont((QFont *)pQVar1);
  local_68 = &((text->d).d)->super_QArrayData;
  pcStack_60 = (text->d).ptr;
  local_58 = (text->d).size;
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::replace((QChar)(char16_t)&local_68,(QChar)0xa,0x2028);
  local_38 = local_58;
  pcStack_40 = pcStack_60;
  local_48 = local_68;
  local_68 = (QArrayData *)0x0;
  pcStack_60 = (char16_t *)0x0;
  local_58 = 0;
  QTextLayout::setText((QString *)pQVar1);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  QVar7 = QItemDelegatePrivate::doTextLayout(this_00,((rect->x2).m_i - (rect->x1).m_i) + 1);
  dVar2 = ceil(QVar7.wd);
  dVar3 = ceil(QVar7.ht);
  pQVar6 = QApplication::style();
  iVar5 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x41,0,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    auVar4._4_4_ = (int)dVar3 + -1;
    auVar4._0_4_ = (int)dVar2 + iVar5 * 2 + 1;
    auVar4._8_8_ = 0;
    return (QRect)(auVar4 << 0x40);
  }
  __stack_chk_fail();
}

Assistant:

QRect QItemDelegate::textRectangle(QPainter * /*painter*/, const QRect &rect,
                                   const QFont &font, const QString &text) const
{
    Q_D(const QItemDelegate);
    d->textOption.setWrapMode(QTextOption::WordWrap);
    d->textLayout.setTextOption(d->textOption);
    d->textLayout.setFont(font);
    d->textLayout.setText(QItemDelegatePrivate::replaceNewLine(text));
    QSizeF fpSize = d->doTextLayout(rect.width());
    const QSize size = QSize(qCeil(fpSize.width()), qCeil(fpSize.height()));
    // ###: textRectangle should take style option as argument
    const int textMargin = QApplication::style()->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr) + 1;
    return QRect(0, 0, size.width() + 2 * textMargin, size.height());
}